

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextoption.cpp
# Opt level: O3

void __thiscall QTextOption::setTabArray(QTextOption *this,QList<double> *tabStops)

{
  long lVar1;
  double *pdVar2;
  QTextOptionPrivate *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextOption::Tab> local_68;
  Tab local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d == (QTextOptionPrivate *)0x0) {
    pQVar3 = (QTextOptionPrivate *)operator_new(0x18);
    (pQVar3->tabStops).d.d = (Data *)0x0;
    (pQVar3->tabStops).d.ptr = (Tab *)0x0;
    (pQVar3->tabStops).d.size = 0;
    this->d = pQVar3;
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (Tab *)0x0;
  local_68.size = 0;
  local_48.position = 80.0;
  local_48.type = LeftTab;
  local_48.delimiter.ucs = L'\0';
  local_48._14_2_ = 0xaaaa;
  QList<QTextOption::Tab>::reserve((QList<QTextOption::Tab> *)&local_68,(tabStops->d).size);
  lVar1 = (tabStops->d).size;
  if (lVar1 != 0) {
    pdVar2 = (tabStops->d).ptr;
    lVar4 = 0;
    do {
      local_48.position = *(qreal *)((long)pdVar2 + lVar4);
      QtPrivate::QMovableArrayOps<QTextOption::Tab>::emplace<QTextOption::Tab_const&>
                ((QMovableArrayOps<QTextOption::Tab> *)&local_68,local_68.size,&local_48);
      QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)&local_68);
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  QArrayDataPointer<QTextOption::Tab>::operator=
            ((QArrayDataPointer<QTextOption::Tab> *)this->d,&local_68);
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOption::setTabArray(const QList<qreal> &tabStops)
{
    if (!d)
        d = new QTextOptionPrivate;
    QList<QTextOption::Tab> tabs;
    QTextOption::Tab tab;
    tabs.reserve(tabStops.size());
    for (qreal pos : tabStops) {
        tab.position = pos;
        tabs.append(tab);
    }
    d->tabStops = tabs;
}